

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_ltrim(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  undefined8 in_RAX;
  char *zString;
  ushort **ppuVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  bool bVar9;
  int nLen;
  int nListlen;
  undefined8 local_38;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
    return 0;
  }
  local_38 = in_RAX;
  zString = jx9_value_to_string(*apArg,(int *)&local_38);
  uVar8 = (ulong)(int)(uint)local_38;
  if (0 < (long)uVar8) {
    if (nArg == 1) {
      pcVar6 = zString + uVar8;
      pcVar7 = zString;
      uVar5 = (uint)local_38;
      while (bVar9 = uVar5 != 0, uVar5 = uVar5 - 1, zString = pcVar6, bVar9) {
        cVar1 = *pcVar7;
        zString = pcVar7;
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           ((cVar1 != '\0' &&
            (ppuVar2 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) == 0)))) break;
        pcVar7 = pcVar7 + 1;
        uVar8 = (ulong)uVar5;
      }
      local_38._0_4_ = (uint)uVar8;
      goto LAB_0012b5c1;
    }
    pcVar7 = jx9_value_to_string(apArg[1],(int *)((long)&local_38 + 4));
    if ((long)local_38._4_4_ < 1) goto LAB_0012b5c1;
    pcVar4 = zString + (int)(uint)local_38;
    pcVar6 = zString;
    do {
      zString = pcVar6;
      if (pcVar4 <= zString) goto LAB_0012b59d;
      pcVar6 = zString;
      for (lVar3 = 0; local_38._4_4_ != lVar3; lVar3 = lVar3 + 1) {
        if (pcVar6 < pcVar4) {
          pcVar6 = pcVar6 + (*pcVar6 == pcVar7[lVar3]);
        }
      }
    } while (pcVar6 != zString);
    if (zString < pcVar4) {
      local_38._0_4_ = (int)pcVar4 - (int)zString;
      goto LAB_0012b5c1;
    }
  }
LAB_0012b59d:
  zString = "";
  local_38._0_4_ = 0;
LAB_0012b5c1:
  jx9_result_string(pCtx,zString,(uint)local_38);
  return 0;
}

Assistant:

static int jx9Builtin_ltrim(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string, return */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Start the trim process */
	if( nArg < 2 ){
		SyString sStr;
		/* Remove white spaces and NUL byte */
		SyStringInitFromBuf(&sStr, zString, nLen);
		SyStringLeftTrimSafe(&sStr);
		jx9_result_string(pCtx, sStr.zString, (int)sStr.nByte);
	}else{
		/* Char list */
		const char *zList;
		int nListlen;
		zList = jx9_value_to_string(apArg[1], &nListlen);
		if( nListlen < 1 ){
			/* Return the string unchanged */
			jx9_result_string(pCtx, zString, nLen);
		}else{
			const char *zEnd = &zString[nLen];
			const char *zCur = zString;
			const char *zPtr;
			int i;
			/* Left trim */
			for(;;){
				if( zCur >= zEnd ){
					break;
				}
				zPtr = zCur;
				for( i = 0 ; i < nListlen ; i++ ){
					if( zCur < zEnd && zCur[0] == zList[i] ){
						zCur++;
					}
				}
				if( zCur == zPtr ){
					/* No match, break immediately */
					break;
				}
			}
			if( zCur >= zEnd ){
				/* Return the empty string */
				jx9_result_string(pCtx, "", 0);
			}else{
				jx9_result_string(pCtx, zCur, (int)(zEnd-zCur));
			}
		}
	}
	return JX9_OK;
}